

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D5xNvmFlash.cpp
# Opt level: O3

void __thiscall D5xNvmFlash::writeOptions(D5xNvmFlash *this)

{
  WordCopyApplet *this_00;
  bool *pbVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  _Bvector_impl *p_Var4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  _Bit_type *p_Var10;
  pointer *__ptr;
  uint32_t dstAddr;
  ulong uVar11;
  uint uVar12;
  _Head_base<0UL,_unsigned_char_*,_false> _Var13;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __last1;
  _Bit_iterator __first2;
  _Head_base<0UL,_unsigned_char_*,_false> local_58;
  void *local_50 [4];
  long local_30;
  
  local_58._M_head_impl = (byte *)0x0;
  iVar8 = (*(this->super_Flash)._vptr_Flash[0x13])();
  if (((char)iVar8 != '\0') && ((this->super_Flash)._bor._dirty == true)) {
    bVar5 = (this->super_Flash)._bor._value;
    iVar8 = (*(this->super_Flash)._vptr_Flash[0x11])(this);
    if (bVar5 != (bool)(char)iVar8) {
      readUserPage(this,(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        &local_58);
      local_58._M_head_impl[1] =
           (this->super_Flash)._bor._value * '\x02' | local_58._M_head_impl[1] & 0xfd;
      _Var13._M_head_impl = local_58._M_head_impl;
      goto LAB_0010d820;
    }
  }
  _Var13._M_head_impl = (byte *)0x0;
LAB_0010d820:
  iVar8 = (*(this->super_Flash)._vptr_Flash[0x10])(this);
  if (((char)iVar8 != '\0') && ((this->super_Flash)._bod._dirty == true)) {
    bVar5 = (this->super_Flash)._bod._value;
    iVar8 = (*(this->super_Flash)._vptr_Flash[0xe])(this);
    if (bVar5 != (bool)(char)iVar8) {
      readUserPage(this,(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        &local_58);
      *local_58._M_head_impl = (*local_58._M_head_impl & 0xfe | (this->super_Flash)._bod._value) ^ 1
      ;
      _Var13._M_head_impl = local_58._M_head_impl;
    }
  }
  if ((this->super_Flash)._regions._dirty == true) {
    (*(this->super_Flash)._vptr_Flash[10])(local_50);
    p_Var4 = &(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>._M_impl
    ;
    uVar2 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
    uVar3 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
    __last1.super__Bit_iterator_base._M_offset = uVar3;
    __last1.super__Bit_iterator_base._M_p = (_Bit_type *)uVar2;
    __first1.super__Bit_iterator_base._8_8_ = 0;
    __first1.super__Bit_iterator_base._M_p =
         (this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p = (_Bit_type *)local_50[0];
    bVar5 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_iterator>
                      (__first1,__last1,__first2);
    if (!bVar5) {
      readUserPage(this,(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        &local_58);
      p_Var10 = (this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      _Var13._M_head_impl = local_58._M_head_impl;
      if (((long)(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                 _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)p_Var10) * 8 +
          (ulong)(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                 _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0)
      {
        uVar9 = 1;
        uVar11 = 0;
        do {
          uVar12 = uVar9 - 1 >> 3;
          bVar7 = (byte)(1 << ((byte)(uVar9 - 1) & 7));
          bVar6 = ~bVar7 & (local_58._M_head_impl + 8)[uVar12];
          if ((*(ulong *)((long)p_Var10 + (ulong)(uVar12 & 0xfffffff8)) >> (uVar11 & 0x3f) & 1) == 0
             ) {
            bVar6 = (local_58._M_head_impl + 8)[uVar12] | bVar7;
          }
          (local_58._M_head_impl + 8)[uVar12] = bVar6;
          uVar11 = (ulong)uVar9;
          p_Var10 = (this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          uVar9 = uVar9 + 1;
        } while (uVar11 < (ulong)(this->super_Flash)._regions._value.
                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                 _M_offset +
                          ((long)(this->super_Flash)._regions._value.
                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                          (long)p_Var10) * 8);
      }
    }
    if (local_50[0] != (void *)0x0) {
      operator_delete(local_50[0],local_30 - (long)local_50[0]);
    }
  }
  if (_Var13._M_head_impl != (byte *)0x0) {
    bVar6 = Samba::readByte((this->super_Flash)._samba,0x41004000);
    bVar7 = Samba::readByte((this->super_Flash)._samba,0x41004001);
    Samba::writeByte((this->super_Flash)._samba,0x41004000,bVar6 & 0xcf);
    Samba::writeByte((this->super_Flash)._samba,0x41004001,bVar7 | 0xc0);
    Samba::writeWord((this->super_Flash)._samba,0x41004014,0x804000);
    command(this,'\0');
    if ((this->super_Flash)._size != 0) {
      this_00 = &(this->super_Flash)._wordCopy;
      uVar11 = 0;
      do {
        (*(this->super_Flash)._vptr_Flash[0x1b])(this,_Var13._M_head_impl + uVar11,0x10);
        command(this,'\x15');
        dstAddr = (int)uVar11 + 0x804000;
        WordCopyApplet::setDstAddr(this_00,dstAddr);
        WordCopyApplet::setSrcAddr
                  (this_00,(&(this->super_Flash)._pageBufferA)[(this->super_Flash)._onBufferA ^ 1]);
        WordCopyApplet::setWords(this_00,4);
        pbVar1 = &(this->super_Flash)._onBufferA;
        *pbVar1 = (bool)(*pbVar1 ^ 1);
        waitReady(this);
        Applet::runv(&this_00->super_Applet);
        Samba::writeWord((this->super_Flash)._samba,0x41004014,dstAddr);
        command(this,'\x04');
        uVar9 = (int)uVar11 + 0x10;
        uVar11 = (ulong)uVar9;
      } while (uVar9 < (this->super_Flash)._size);
    }
  }
  if (((this->super_Flash)._security._dirty == true) &&
     ((this->super_Flash)._security._value == true)) {
    iVar8 = (*(this->super_Flash)._vptr_Flash[0xc])(this);
    if ((char)iVar8 != '\x01') {
      command(this,'\x16');
    }
  }
  if (_Var13._M_head_impl != (byte *)0x0) {
    operator_delete__(_Var13._M_head_impl);
  }
  return;
}

Assistant:

void
D5xNvmFlash::writeOptions()
{
    std::unique_ptr<uint8_t[]> userPage;

    if (canBor() && _bor.isDirty() && _bor.get() != getBor())
    {
        readUserPage(userPage);
        if (_bor.get())
            userPage[NVM_UP_BOD33_RESET_OFFSET] |= NVM_UP_BOD33_RESET_MASK;
        else
            userPage[NVM_UP_BOD33_RESET_OFFSET] &= ~NVM_UP_BOD33_RESET_MASK;
    }
    if (canBod() && _bod.isDirty() && _bod.get() != getBod())
    {
        readUserPage(userPage);
        if (_bod.get())
            userPage[NVM_UP_BOD33_DISABLE_OFFSET] &= ~NVM_UP_BOD33_DISABLE_MASK;
        else
            userPage[NVM_UP_BOD33_DISABLE_OFFSET] |= NVM_UP_BOD33_DISABLE_MASK;
    }
    if (_regions.isDirty())
    {
        // Check if any lock bits are different from the current set
        std::vector<bool> current = getLockRegions();
        if (!equal(_regions.get().begin(), _regions.get().end(), current.begin()))
        {
            readUserPage(userPage);

            uint8_t* lockBits = &userPage[NVM_UP_NVM_LOCK_OFFSET];
            for (uint32_t region = 0; region < _regions.get().size(); region++)
            {
                if (_regions.get()[region])
                    lockBits[region / 8] &= ~(1 << (region % 8));
                else
                    lockBits[region / 8] |= (1 << (region % 8));
            }
        }
    }

    // Erase and write the user page if modified
    if (userPage)
    {
        // Configure manual page write and disable caches
        writeRegU16(NVM_REG_CTRLA, (readRegU16(NVM_REG_CTRLA) | (0x3 << 14)) & 0xffcf);

        // Erase user page
        writeRegU32(NVM_REG_ADDR, NVM_UP_ADDR);
        command(NVM_CMD_EP);

        // Write user page in quad-word chunks
        for (uint32_t offset = 0; offset < NVM_UP_SIZE; offset += 16)
        {
            // Load the buffer with the quad word
            loadBuffer(&userPage[offset], 16);

            // Clear page buffer
            command(NVM_CMD_PBC);

            // Copy quad word to page buffer
            _wordCopy.setDstAddr(NVM_UP_ADDR + offset);
            _wordCopy.setSrcAddr(_onBufferA ? _pageBufferA : _pageBufferB);
            _wordCopy.setWords(4);
            _onBufferA = !_onBufferA;
            waitReady();
            _wordCopy.runv();

            // Write the quad word
            writeRegU32(NVM_REG_ADDR, NVM_UP_ADDR + offset);
            command(NVM_CMD_WQW);
        }
    }

    // Always do security last
    if (_security.isDirty() && _security.get() == true && _security.get() != getSecurity())
    {
        command(NVM_CMD_SSB);
    }
}